

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qotd.cc
# Opt level: O1

void unescapeQuote(string *quote)

{
  ulong uVar1;
  string target;
  string replacement;
  undefined1 *local_60;
  char *local_58;
  undefined1 local_50 [16];
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\\n","");
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"\n","");
  for (uVar1 = std::__cxx11::string::find((char *)quote,(ulong)local_60,0);
      uVar1 != 0xffffffffffffffff;
      uVar1 = std::__cxx11::string::find((char *)quote,(ulong)local_60,uVar1 + local_38)) {
    std::__cxx11::string::replace((ulong)quote,uVar1,local_58,(ulong)local_40);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return;
}

Assistant:

void unescapeQuote( std::string& quote )
{
  std::size_t position    = 0;
  std::string target      = "\\n";
  std::string replacement = "\n";
  while( ( position = quote.find( target, position ) ) != std::string::npos )
  {
    quote.replace( position, target.length(), replacement );
    position += replacement.length();
  }
}